

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

void * rw::d3d::copyNativeRaster(void *dst,void *param_2,int32 offset,int32 param_4)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = (long)offset;
  *(undefined2 *)((long)dst + lVar2 + 0x20) = 0;
  *(undefined8 *)((long)dst + lVar2) = 0;
  ((undefined8 *)((long)dst + lVar2))[1] = 0;
  puVar1 = (undefined8 *)((long)dst + lVar2 + 0xc);
  *puVar1 = 0;
  puVar1[1] = 0;
  return dst;
}

Assistant:

static void*
copyNativeRaster(void *dst, void *, int32 offset, int32)
{
	D3dRaster *raster = PLUGINOFFSET(D3dRaster, dst, offset);
	raster->texture = nil;
	raster->palette = nil;
	raster->lockedSurf = nil;
	raster->format = 0;
	raster->hasAlpha = 0;
	raster->customFormat = 0;
	return dst;
}